

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::instrs<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined1 *puVar1;
  uint pos;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  int iVar5;
  string local_168;
  string local_148;
  string local_128;
  undefined1 local_108 [8];
  WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> with;
  size_type __dnew_1;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  undefined1 auStack_d8 [8];
  MaybeResult<wasm::WATParser::Ok> blockinst;
  undefined1 local_a8 [8];
  MaybeResult<wasm::WATParser::Ok> _val;
  pointer ppStack_78;
  vector<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
  foldedInstrs;
  undefined1 local_58 [8];
  MaybeResult<wasm::WATParser::Ok> _val_1;
  
  _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  _32_8_ = (long)&(__return_storage_ptr__->val).
                  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10;
  blockinst.val.
  super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
  _32_8_ = __return_storage_ptr__;
  do {
    while( true ) {
      do {
        foldedBlockinstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                  ((MaybeResult<wasm::WATParser::Ok> *)auStack_d8,ctx);
        iVar5 = 0;
        if (blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._24_1_ != '\x01') {
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_a8,
                          (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)auStack_d8);
          if (_val.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ == '\x02') {
            puVar1 = (undefined1 *)
                     ((long)&_val_1.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 8);
            local_58 = (undefined1  [8])puVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_58,CONCAT44(local_a8._4_4_,local_a8._0_4_),
                       CONCAT44(_val.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                ._M_u._4_4_,
                                _val.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                ._M_u._0_4_) + CONCAT44(local_a8._4_4_,local_a8._0_4_));
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
                 _val.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._32_8_;
            if (local_58 == (undefined1  [8])puVar1) {
              *(ulong *)_val.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._32_8_ =
                   CONCAT71(_val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._9_7_,
                            _val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._8_1_);
              *(undefined8 *)
               (_val.val.
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._32_8_ + 8) =
                   _val_1.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   ._M_u._16_8_;
            }
            else {
              *(undefined1 (*) [8])
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = local_58;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                        + 0x10) =
                   CONCAT71(_val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._9_7_,
                            _val_1.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._8_1_);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
                 _val_1.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._M_u._0_8_;
            _val_1.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._0_8_ = 0;
            _val_1.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                 = '\x01';
            local_58 = (undefined1  [8])puVar1;
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 *)local_a8);
            iVar5 = 1;
          }
          else {
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 *)local_a8);
            iVar5 = 2;
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)auStack_d8);
      } while (iVar5 == 2);
      if (iVar5 != 0) {
        return __return_storage_ptr__;
      }
      bVar2 = ParseInput::takeLParen(&ctx->in);
      if (bVar2) break;
      instr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                ((MaybeResult<wasm::WATParser::Ok> *)auStack_d8,ctx);
      iVar5 = 3;
      if (blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ != '\x01') {
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_a8,
                        (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)auStack_d8);
        if (_val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._24_1_ == '\x02') {
          puVar1 = (undefined1 *)
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 8);
          local_58 = (undefined1  [8])puVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,CONCAT44(local_a8._4_4_,local_a8._0_4_),
                     CONCAT44(_val.val.
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              ._M_u._4_4_,
                              _val.val.
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              .
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                              ._M_u._0_4_) + CONCAT44(local_a8._4_4_,local_a8._0_4_));
          *(undefined8 *)
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
               _val.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_;
          if (local_58 == (undefined1  [8])puVar1) {
            *(ulong *)_val.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._32_8_ =
                 CONCAT71(_val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
            *(undefined8 *)
             (_val.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._32_8_ + 8) =
                 _val_1.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = local_58;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                      + 0x10) =
                 CONCAT71(_val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
               _val_1.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._M_u._0_8_;
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._0_8_ = 0;
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
               '\x01';
          local_58 = (undefined1  [8])puVar1;
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)local_a8);
          iVar5 = 1;
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)local_a8);
          iVar5 = 0;
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)auStack_d8);
      if (iVar5 != 0) {
        if (iVar5 == 3) {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
               '\0';
        }
        return __return_storage_ptr__;
      }
    }
    ppStack_78 = (pointer)0x0;
    foldedInstrs.
    super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    foldedInstrs.
    super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_d8._0_4_ = ParseInput::getPos(&ctx->in);
    auStack_d8._4_4_ = 0;
    blockinst.val.
    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
    _M_u._0_4_ = 0;
    if (foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
      ::_M_realloc_insert<std::pair<unsigned_int,std::optional<unsigned_int>>>
                ((vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
                  *)&ppStack_78,
                 (iterator)
                 foldedInstrs.
                 super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pair<unsigned_int,_std::optional<unsigned_int>_> *)auStack_d8);
    }
    else {
      *(undefined4 *)
       &((foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->second).
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = 0;
      (foldedInstrs.
       super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->first = (int)(ulong)(uint)auStack_d8._0_4_;
      ((foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->second).
      super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           (_Storage<unsigned_int,_true>)(int)((ulong)(uint)auStack_d8._0_4_ >> 0x20);
      foldedInstrs.
      super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           foldedInstrs.
           super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    while (ppStack_78 !=
           foldedInstrs.
           super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = ParseInput::takeUntilParen(&ctx->in);
      if (!bVar2) {
        IVar3 = foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].first;
        local_a8._0_4_ = 0x1f;
        local_a8._4_4_ = 0;
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        local_168._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_168,(ulong)local_a8);
        local_168._M_string_length = CONCAT44(local_a8._4_4_,local_a8._0_4_);
        builtin_strncpy(local_168._M_dataplus._M_p,"unterminated folded instruction",0x1f);
        local_168._M_dataplus._M_p[local_168._M_string_length] = '\0';
        local_168.field_2._M_allocated_capacity = local_168._M_string_length;
        ParseInput::err((Err *)auStack_d8,&ctx->in,IVar3,&local_168);
        *(undefined8 *)
         blockinst.val.
         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
         ._32_8_ = _val.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   ._32_8_;
        puVar1 = (undefined1 *)
                 ((long)&blockinst.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 8);
        if ((undefined1 *)CONCAT44(auStack_d8._4_4_,auStack_d8._0_4_) == puVar1) {
          *(ulong *)_val.val.
                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    ._32_8_ =
               CONCAT71(blockinst.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._9_7_,
                        blockinst.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._8_1_);
          *(undefined8 *)
           (_val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ + 8) =
               blockinst.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._M_u._16_8_;
        }
        else {
          *(undefined1 **)
           blockinst.val.
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           ._32_8_ = (undefined1 *)CONCAT44(auStack_d8._4_4_,auStack_d8._0_4_);
          *(ulong *)(blockinst.val.
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     ._32_8_ + 0x10) =
               CONCAT71(blockinst.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._9_7_,
                        blockinst.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._8_1_);
        }
        *(ulong *)(blockinst.val.
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   .
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   ._32_8_ + 8) =
             CONCAT44(blockinst.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._4_4_,
                      blockinst.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._0_4_);
        blockinst.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._0_4_ = 0;
        blockinst.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._4_4_ = 0;
        blockinst.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._8_1_ = 0;
        *(undefined1 *)
         (blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._32_8_ + 0x20) = 1;
        auStack_d8 = (undefined1  [8])puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        __return_storage_ptr__ =
             (Result<wasm::WATParser::Ok> *)
             blockinst.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_;
        goto LAB_00a02904;
      }
      if (foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].second.
          super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        IVar3 = ParseInput::getPos(&ctx->in);
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[-1].second.
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)((ulong)IVar3 | 0x100000000);
      }
      foldedBlockinstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                ((MaybeResult<wasm::WATParser::Ok> *)auStack_d8,ctx);
      if (blockinst.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ != '\x01') {
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_a8,
                        (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)auStack_d8);
        if (_val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._24_1_ != '\x02') {
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)local_a8);
          goto LAB_00a02493;
        }
        puVar1 = (undefined1 *)
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 8);
        local_58 = (undefined1  [8])puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,CONCAT44(local_a8._4_4_,local_a8._0_4_),
                   CONCAT44(_val.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._4_4_,
                            _val.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            ._M_u._0_4_) + CONCAT44(local_a8._4_4_,local_a8._0_4_));
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
             _val.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_;
        if (local_58 == (undefined1  [8])puVar1) {
          *(ulong *)_val.val.
                    super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    ._32_8_ =
               CONCAT71(_val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._9_7_,
                        _val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._8_1_);
          *(undefined8 *)
           (_val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ + 8) =
               _val_1.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                    + 0x10) =
               CONCAT71(_val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._9_7_,
                        _val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
             _val_1.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._M_u._0_8_;
        _val_1.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._0_8_ = 0;
        _val_1.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
             '\x01';
        local_58 = (undefined1  [8])puVar1;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_a8);
LAB_00a028f8:
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)auStack_d8);
LAB_00a02904:
        if (ppStack_78 == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(ppStack_78,
                        (long)foldedInstrs.
                              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_78);
        return __return_storage_ptr__;
      }
      bVar2 = ParseInput::takeLParen(&ctx->in);
      if (!bVar2) {
        bVar2 = ParseInput::takeRParen(&ctx->in);
        if (!bVar2) {
          handle_unreachable("expected paren",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                             ,0xb56);
        }
        if ((foldedInstrs.
             super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-1].second.
             super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged & 1U) == 0) {
          __assert_fail("end && \"Should have found end of instruction\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                        ,0xb47,
                        "Result<typename Ctx::InstrsT> wasm::WATParser::(anonymous namespace)::instrs(Ctx &) [Ctx = wasm::WATParser::(anonymous namespace)::ParseDeclsCtx]"
                       );
        }
        pos = foldedInstrs.
              super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1].first;
        IVar3 = foldedInstrs.
                super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].second.
                super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_payload._M_value;
        local_108 = (undefined1  [8])ctx;
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             foldedInstrs.
             super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
        with.ctx._0_4_ = ParseInput::getPos(&ctx->in);
        (ctx->in).lexer.index = (ulong)pos;
        Lexer::skipSpace((Lexer *)ctx);
        Lexer::lexToken((Lexer *)ctx);
        plaininstr<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                  ((MaybeResult<wasm::WATParser::Ok> *)local_a8,ctx);
        if (_val.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._M_u._24_1_ == '\x01') {
          with.original = 0x1b;
          with._12_4_ = 0;
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          local_148._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_148,(ulong)&with.original);
          local_148.field_2._M_allocated_capacity = with._8_8_;
          builtin_strncpy(local_148._M_dataplus._M_p,"expected folded instruction",0x1b);
          local_148._M_string_length = with._8_8_;
          local_148._M_dataplus._M_p[with._8_8_] = '\0';
          ParseInput::err((Err *)local_58,&ctx->in,pos,&local_148);
          __return_storage_ptr__ =
               (Result<wasm::WATParser::Ok> *)
               blockinst.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_;
          *(undefined8 *)
           blockinst.val.
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
           ._32_8_ = _val.val.
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     ._32_8_;
          puVar1 = (undefined1 *)
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 8);
          if (local_58 == (undefined1  [8])puVar1) {
            *(ulong *)_val.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._32_8_ =
                 CONCAT71(_val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
            *(undefined8 *)
             (_val.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._32_8_ + 8) =
                 _val_1.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._M_u._16_8_;
          }
          else {
            *(undefined1 (*) [8])
             blockinst.val.
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             ._32_8_ = local_58;
            *(ulong *)(blockinst.val.
                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       .
                       super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       ._32_8_ + 0x10) =
                 CONCAT71(_val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val_1.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
          }
          *(undefined8 *)
           (blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ + 8) =
               _val_1.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._M_u._0_8_;
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._0_8_ = 0;
          _val_1.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._8_1_ = 0;
          *(undefined1 *)
           (blockinst.val.
            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ._32_8_ + 0x20) = 1;
          local_58 = (undefined1  [8])puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
LAB_00a02892:
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)local_a8);
        }
        else {
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_58,
                          (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)local_a8);
          __return_storage_ptr__ =
               (Result<wasm::WATParser::Ok> *)
               blockinst.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_;
          if (_val_1.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ == '\x02') {
            with._8_8_ = &local_e8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&with.original,local_58,
                       (undefined1 *)
                       (_val_1.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._0_8_ + (long)local_58));
            *(undefined8 *)__return_storage_ptr__ =
                 _val.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._32_8_;
            if ((undefined1 *)with._8_8_ == &local_e8) {
              *(ulong *)_val.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._32_8_ = CONCAT71(uStack_e7,local_e8);
              *(undefined8 *)
               (_val.val.
                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._32_8_ + 8) = uStack_e0;
            }
            else {
              *(undefined8 *)__return_storage_ptr__ = with._8_8_;
              *(ulong *)((long)__return_storage_ptr__ + 0x10) = CONCAT71(uStack_e7,local_e8);
            }
            *(size_type *)((long)__return_storage_ptr__ + 8) = __dnew_1;
            local_e8 = 0;
            *(undefined1 *)((long)__return_storage_ptr__ + 0x20) = 1;
            with._8_8_ = &local_e8;
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 *)local_58);
            goto LAB_00a02892;
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)local_58);
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               *)local_a8);
          IVar4 = ParseInput::getPos(&ctx->in);
          if (IVar4 == IVar3) {
            WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>::~WithPosition
                      ((WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> *)
                       local_108);
            goto LAB_00a02493;
          }
          local_58 = (undefined1  [8])0x1b;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          local_128._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)local_58);
          local_128.field_2._M_allocated_capacity = (size_type)local_58;
          builtin_strncpy(local_128._M_dataplus._M_p,"expected end of instruction",0x1b);
          local_128._M_string_length = (size_type)local_58;
          local_128._M_dataplus._M_p[(long)local_58] = '\0';
          ParseInput::err((Err *)local_a8,&ctx->in,&local_128);
          *(undefined8 *)__return_storage_ptr__ =
               _val.val.
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
               ._32_8_;
          puVar1 = (undefined1 *)
                   ((long)&_val.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 8);
          if ((undefined1 *)CONCAT44(local_a8._4_4_,local_a8._0_4_) == puVar1) {
            *(ulong *)_val.val.
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._32_8_ =
                 CONCAT71(_val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
            *(undefined8 *)
             (_val.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._32_8_ + 8) =
                 _val.val.
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 ._M_u._16_8_;
          }
          else {
            *(undefined1 **)__return_storage_ptr__ =
                 (undefined1 *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
            *(ulong *)((long)__return_storage_ptr__ + 0x10) =
                 CONCAT71(_val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._9_7_,
                          _val.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._M_u._8_1_);
          }
          *(ulong *)((long)__return_storage_ptr__ + 8) =
               CONCAT44(_val.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._4_4_,
                        _val.val.
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._0_4_);
          _val.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._0_4_ = 0;
          _val.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._4_4_ = 0;
          _val.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._8_1_ = 0;
          *(undefined1 *)((long)__return_storage_ptr__ + 0x20) = 1;
          local_a8 = (undefined1  [8])puVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
        }
        WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>::~WithPosition
                  ((WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx> *)local_108)
        ;
        goto LAB_00a028f8;
      }
      local_a8._0_4_ = ParseInput::getPos(&ctx->in);
      local_a8._4_4_ = 0;
      _val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      ._M_u._0_4_ = 0;
      if (foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
        ::_M_realloc_insert<std::pair<unsigned_int,std::optional<unsigned_int>>>
                  ((vector<std::pair<unsigned_int,std::optional<unsigned_int>>,std::allocator<std::pair<unsigned_int,std::optional<unsigned_int>>>>
                    *)&ppStack_78,
                   (iterator)
                   foldedInstrs.
                   super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pair<unsigned_int,_std::optional<unsigned_int>_> *)local_a8);
      }
      else {
        *(undefined4 *)
         &((foldedInstrs.
            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->second).
          super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged = 0;
        (foldedInstrs.
         super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->first = (int)(ulong)(uint)local_a8._0_4_;
        ((foldedInstrs.
          super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->second).
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             (_Storage<unsigned_int,_true>)(int)((ulong)(uint)local_a8._0_4_ >> 0x20);
        foldedInstrs.
        super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             foldedInstrs.
             super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
LAB_00a02493:
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)auStack_d8);
    }
    if (ppStack_78 != (pointer)0x0) {
      operator_delete(ppStack_78,
                      (long)foldedInstrs.
                            super__Vector_base<std::pair<unsigned_int,_std::optional<unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_std::optional<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppStack_78);
    }
  } while( true );
}

Assistant:

Result<typename Ctx::InstrsT> instrs(Ctx& ctx) {
  auto insts = ctx.makeInstrs();

  while (true) {
    if (auto blockinst = foldedBlockinstr(ctx)) {
      CHECK_ERR(blockinst);
      ctx.appendInstr(insts, *blockinst);
      continue;
    }
    // Parse an arbitrary number of folded instructions.
    if (ctx.in.takeLParen()) {
      // A stack of (start, end) position pairs defining the positions of
      // instructions that need to be parsed after their folded children.
      std::vector<std::pair<Index, std::optional<Index>>> foldedInstrs;

      // Begin a folded instruction. Push its start position and a placeholder
      // end position.
      foldedInstrs.push_back({ctx.in.getPos(), {}});
      while (!foldedInstrs.empty()) {
        // Consume everything up to the next paren. This span will be parsed as
        // an instruction later after its folded children have been parsed.
        if (!ctx.in.takeUntilParen()) {
          return ctx.in.err(foldedInstrs.back().first,
                            "unterminated folded instruction");
        }

        if (!foldedInstrs.back().second) {
          // The folded instruction we just started should end here.
          foldedInstrs.back().second = ctx.in.getPos();
        }

        // We have either the start of a new folded child or the end of the last
        // one.
        if (auto blockinst = foldedBlockinstr(ctx)) {
          CHECK_ERR(blockinst);
          ctx.appendInstr(insts, *blockinst);
        } else if (ctx.in.takeLParen()) {
          foldedInstrs.push_back({ctx.in.getPos(), {}});
        } else if (ctx.in.takeRParen()) {
          auto [start, end] = foldedInstrs.back();
          assert(end && "Should have found end of instruction");
          foldedInstrs.pop_back();

          WithPosition with(ctx, start);
          if (auto inst = plaininstr(ctx)) {
            CHECK_ERR(inst);
            ctx.appendInstr(insts, *inst);
          } else {
            return ctx.in.err(start, "expected folded instruction");
          }

          if (ctx.in.getPos() != *end) {
            return ctx.in.err("expected end of instruction");
          }
        } else {
          WASM_UNREACHABLE("expected paren");
        }
      }
      continue;
    }

    // A non-folded instruction.
    if (auto inst = instr(ctx)) {
      CHECK_ERR(inst);
      ctx.appendInstr(insts, *inst);
    } else {
      break;
    }
  }

  return ctx.finishInstrs(insts);
}